

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_TooFewBreakpoints_Test::TestBody(ExprTest_TooFewBreakpoints_Test *this)

{
  Reference arg;
  PLTermBuilder builder_00;
  undefined1 uVar1;
  bool bVar2;
  AssertHelper *this_00;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  PLTermBuilder builder;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  Type in_stack_fffffffffffffefc;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  allocator<char> local_59;
  string local_58 [48];
  AssertionResult local_28;
  PLTermBuilder local_18;
  
  local_18 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                       (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)in_stack_fffffffffffffef0,
             (double)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)in_stack_fffffffffffffef0,
             (double)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  testing::AssertionSuccess();
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if ((bool)uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (allocator<char> *)in_stack_ffffffffffffff00);
    std::allocator<char>::~allocator(&local_59);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_fffffffffffffec8,0);
      builder_00._8_8_ = in_stack_ffffffffffffff08;
      builder_00.impl_ = (Impl *)in_stack_ffffffffffffff00;
      arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
           in_stack_fffffffffffffefc;
      arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
           in_stack_fffffffffffffef8;
      mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
                (in_stack_fffffffffffffef0,builder_00,arg);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)in_stack_ffffffffffffff00,
               (char (*) [139])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::__cxx11::string::~string(local_58);
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff00);
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x122c94);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff50,(Message *)CONCAT17(uVar1,in_stack_ffffffffffffff48));
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x122cf1);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122d46);
  return;
}

Assistant:

TEST_F(ExprTest, TooFewBreakpoints) {
  auto builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddSlope(1);
  EXPECT_ASSERT(factory_.EndPLTerm(builder, factory_.MakeVariable(0)),
                "too few breakpoints");
}